

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_20;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_local;
  ostream *ofs_local;
  
  std::operator<<(ofs,"[");
  local_20 = 0;
  while( true ) {
    sVar1 = vector<unsigned_long,_std::allocator<unsigned_long>_>::size(v);
    if (sVar1 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(ofs,", ");
    }
    pvVar2 = vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](v,local_20);
    std::ostream::operator<<(ofs,*pvVar2);
    local_20 = local_20 + 1;
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<uint64_t> &v) {
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
  char buf[32];
#endif

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
    tinyusdz::itoa(v[i], buf);
    ofs << buf;
#else
    ofs << v[i];
#endif
  }
  ofs << "]";

  return ofs;
}